

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_urlEncode(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  byte bVar1;
  ushort uVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  ulong uVar8;
  size_t byte_size;
  long lVar9;
  byte *pbVar10;
  
  if (getp_urlEncode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar6 = __cxa_guard_acquire(&getp_urlEncode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                 ::desc);
    if (iVar6 != 0) {
      getp_urlEncode::desc.min_argc_ = 0;
      getp_urlEncode::desc.opt_argc_ = 0;
      getp_urlEncode::desc.varargs_ = 0;
      __cxa_guard_release(&getp_urlEncode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc
                         );
    }
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_urlEncode::desc);
  pvVar5 = sp_;
  if (iVar6 == 0) {
    uVar4 = *(undefined4 *)&self_val->field_0x4;
    aVar3 = self_val->val;
    sp_ = sp_ + 1;
    pvVar5->typ = self_val->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar3;
    uVar2 = *(ushort *)str;
    byte_size = 0;
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      bVar1 = str[uVar8 + 2];
      if ((0x3f < bVar1 - 0x20) ||
         (lVar9 = 1, (0x8000000000002001U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) == 0)) {
        lVar9 = (ulong)(0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) * 2 + 1;
        if ((byte)(bVar1 - 0x30) < 10) {
          lVar9 = 1;
        }
      }
      byte_size = byte_size + lVar9;
    }
    vVar7 = create(0,byte_size);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    pbVar10 = (byte *)(*(long *)((long)&G_obj_table_X.pages_[vVar7 >> 0xc][vVar7 & 0xfff].ptr_ + 8)
                      + 2);
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      bVar1 = str[uVar8 + 2];
      if ((bVar1 == 0x5f) || (bVar1 == 0x2d)) {
LAB_002a49c4:
        *pbVar10 = bVar1;
LAB_002a49c7:
        pbVar10 = pbVar10 + 1;
      }
      else {
        if (bVar1 == 0x20) {
          *pbVar10 = 0x2b;
          goto LAB_002a49c7;
        }
        if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))
        goto LAB_002a49c4;
        *pbVar10 = 0x25;
        byte_to_xdigits((char *)(pbVar10 + 1),bVar1);
        pbVar10 = pbVar10 + 3;
      }
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_urlEncode(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* save my own value for gc protection */
    G_stk->push(self_val);

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* scan the string and determine the size of the expansion */
    size_t outlen;
    const char *p;
    size_t rem;
    for (outlen = 0, p = str, rem = len ; rem != 0 ; ++p, --rem)
    {
        /* 
         *   if this is a space, letter, digit, or '-' or '_', it requires
         *   one byte in the output; otherwise it requires three bytes for
         *   the "%xx" sequence 
         */
        char c = *p;
        if (c == ' ' || c == '-' || c == '_'
            || (c >= 'a' && c <= 'z')
            || (c >= 'A' && c <= 'Z')
            || (c >= '0' && c <= '9'))
            outlen += 1;
        else
            outlen += 3;
    }

    /* allocate the return string */
    retval->set_obj(create(vmg_ FALSE, outlen));
    char *dst =
        ((CVmObjString *)vm_objp(vmg_ retval->val.obj))->cons_get_buf();

    /* build the return string */
    for (p = str, rem = len ; rem != 0 ; ++p, --rem)
    {
        /* translate this byte */
        char c = *p;
        if (c == ' ')
        {
            /* translate ' ' to '+' */
            *dst++ = '+';
        }
        else if (c == '-' || c == '_'
                 || (c >= 'a' && c <= 'z')
                 || (c >= 'A' && c <= 'Z')
                 || (c >= '0' && c <= '9'))
        {
            /* letter, digit, '-', '_' - leave unchanged */
            *dst++ = c;
        }
        else
        {
            /* translate anything else to a %xx sequence */
            *dst++ = '%';
            byte_to_xdigits(dst, (unsigned char)c);
            dst += 2;
        }
    }

    /* discard gc protection */
    G_stk->discard(1);

    /* done */
    return TRUE;
}